

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_chdir(char *file,wchar_t line,char *pathname)

{
  int iVar1;
  char *pathname_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  iVar1 = chdir(pathname);
  if (iVar1 != 0) {
    failure_start(file,line,"chdir(\"%s\")",pathname);
    failure_finish((void *)0x0);
  }
  file_local._4_4_ = (wchar_t)(iVar1 == 0);
  return file_local._4_4_;
}

Assistant:

int
assertion_chdir(const char *file, int line, const char *pathname)
{
	assertion_count(file, line);
	if (chdir(pathname) == 0)
		return (1);
	failure_start(file, line, "chdir(\"%s\")", pathname);
	failure_finish(NULL);
	return (0);

}